

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrMultisamplePixelBufferAccess.cpp
# Opt level: O2

void rr::resolveMultisampleDepthBuffer
               (PixelBufferAccess *dst,MultisampleConstPixelBufferAccess *src)

{
  int iVar1;
  int y;
  int y_00;
  int s;
  int x_00;
  int x;
  int x_01;
  float fVar2;
  float fVar3;
  PixelBufferAccess effectiveDst;
  ConstPixelBufferAccess effectiveSrc;
  PixelBufferAccess local_d0;
  ConstPixelBufferAccess local_a8;
  ConstPixelBufferAccess local_80;
  ConstPixelBufferAccess local_58;
  
  y_00 = 0;
  tcu::getEffectiveDepthStencilAccess(&local_a8,&src->m_access,MODE_DEPTH);
  tcu::getEffectiveDepthStencilAccess(&local_d0,dst,MODE_DEPTH);
  iVar1 = (src->m_access).m_size.m_data[0];
  if (iVar1 == 1) {
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_80,&local_a8);
    MultisampleConstPixelBufferAccess::toSinglesampleAccess
              (&local_58,(MultisampleConstPixelBufferAccess *)&local_80);
    tcu::copy((EVP_PKEY_CTX *)&local_d0,(EVP_PKEY_CTX *)&local_58);
  }
  else {
    for (; y_00 < (dst->super_ConstPixelBufferAccess).m_size.m_data[1]; y_00 = y_00 + 1) {
      for (x_01 = 0; x_01 < (dst->super_ConstPixelBufferAccess).m_size.m_data[0]; x_01 = x_01 + 1) {
        fVar2 = 0.0;
        for (x_00 = 0; x_00 < (src->m_access).m_size.m_data[0]; x_00 = x_00 + 1) {
          fVar3 = tcu::ConstPixelBufferAccess::getPixDepth(&local_a8,x_00,x_01,y_00);
          fVar2 = fVar2 + fVar3;
        }
        tcu::PixelBufferAccess::setPixDepth(&local_d0,fVar2 * (1.0 / (float)iVar1),x_01,y_00,0);
      }
    }
  }
  return;
}

Assistant:

void resolveMultisampleDepthBuffer (const tcu::PixelBufferAccess& dst, const MultisampleConstPixelBufferAccess& src)
{
	DE_ASSERT(dst.getWidth() == src.raw().getHeight());
	DE_ASSERT(dst.getHeight() == src.raw().getDepth());

	const tcu::ConstPixelBufferAccess	effectiveSrc = tcu::getEffectiveDepthStencilAccess(src.raw(), tcu::Sampler::MODE_DEPTH);
	const tcu::PixelBufferAccess		effectiveDst = tcu::getEffectiveDepthStencilAccess(dst, tcu::Sampler::MODE_DEPTH);

	if (src.getNumSamples() == 1)
	{
		// fast-path for non-multisampled cases
		tcu::copy(effectiveDst, MultisampleConstPixelBufferAccess::fromMultisampleAccess(effectiveSrc).toSinglesampleAccess());
	}
	else
	{
		const float numSamplesInv = 1.0f / (float)src.getNumSamples();

		for (int y = 0; y < dst.getHeight(); y++)
		for (int x = 0; x < dst.getWidth(); x++)
		{
			float sum = 0.0f;
			for (int s = 0; s < src.getNumSamples(); s++)
				sum += effectiveSrc.getPixDepth(s, x, y);

			effectiveDst.setPixDepth(sum*numSamplesInv, x, y);
		}
	}
}